

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

void inproc_accept_clients(inproc_ep *srv)

{
  inproc_queue *list;
  inproc_queue *list_00;
  nni_list *list_01;
  int iVar1;
  inproc_ep *ep;
  inproc_ep *piVar2;
  nni_aio *aio;
  nni_aio *aio_00;
  inproc_pair *rc;
  void *pvVar3;
  inproc_pipe *pipe;
  nni_list *list_02;
  inproc_pipe *local_40;
  inproc_pipe *cpipe;
  inproc_pipe *spipe;
  
  list_02 = &srv->clients;
  ep = (inproc_ep *)nni_list_first(list_02);
  if (ep != (inproc_ep *)0x0) {
    do {
      piVar2 = (inproc_ep *)nni_list_next(list_02,ep);
      list_01 = &ep->aios;
      aio = (nni_aio *)nni_list_first(list_01);
      while ((aio != (nni_aio *)0x0 &&
             (aio_00 = (nni_aio *)nni_list_first(&srv->aios), aio_00 != (nni_aio *)0x0))) {
        rc = (inproc_pair *)nni_zalloc(0xd8);
        if (rc == (inproc_pair *)0x0) {
          inproc_conn_finish(aio,2,ep,(inproc_pipe *)0x0);
          iVar1 = 2;
LAB_00127c27:
          pipe = (inproc_pipe *)0x0;
        }
        else {
          list = rc->queues;
          nni_aio_list_init(&list->readers);
          nni_aio_list_init(&rc->queues[0].writers);
          nni_mtx_init(&rc->queues[0].lock);
          list_00 = rc->queues + 1;
          nni_aio_list_init(&list_00->readers);
          nni_aio_list_init(&rc->queues[1].writers);
          nni_mtx_init(&rc->queues[1].lock);
          nni_refcnt_init((nni_refcnt *)rc,2,rc,inproc_pair_destroy);
          local_40 = (inproc_pipe *)0x0;
          cpipe = (inproc_pipe *)0x0;
          iVar1 = nni_pipe_alloc_dialer(&local_40,ep->dialer);
          if ((iVar1 != 0) || (iVar1 = nni_pipe_alloc_listener(&cpipe,srv->listener), iVar1 != 0)) {
            if (local_40 == (inproc_pipe *)0x0) {
              nni_refcnt_rele((nni_refcnt *)rc);
            }
            else {
              nni_pipe_close(local_40->pipe);
              nni_pipe_rele(local_40->pipe);
            }
            if (cpipe == (inproc_pipe *)0x0) {
              nni_refcnt_rele((nni_refcnt *)rc);
            }
            else {
              nni_pipe_close(cpipe->pipe);
              nni_pipe_rele(cpipe->pipe);
            }
            inproc_conn_finish(aio,iVar1,ep,(inproc_pipe *)0x0);
            goto LAB_00127c27;
          }
          local_40->proto = ep->proto;
          local_40->addr = ep->addr;
          cpipe->proto = srv->proto;
          cpipe->addr = srv->addr;
          local_40->peer = cpipe->proto;
          cpipe->peer = local_40->proto;
          local_40->pair = rc;
          cpipe->pair = rc;
          local_40->send_queue = list;
          local_40->recv_queue = list_00;
          cpipe->send_queue = list_00;
          cpipe->recv_queue = list;
          inproc_conn_finish(aio,0,ep,local_40);
          iVar1 = 0;
          pipe = cpipe;
        }
        inproc_conn_finish(aio_00,iVar1,srv,pipe);
        aio = (nni_aio *)nni_list_next(list_01,aio);
      }
      pvVar3 = nni_list_first(list_01);
      if ((pvVar3 == (void *)0x0) && (iVar1 = nni_list_active(list_02,ep), iVar1 != 0)) {
        nni_list_remove(list_02,ep);
      }
      ep = piVar2;
    } while (piVar2 != (inproc_ep *)0x0);
  }
  return;
}

Assistant:

static void
inproc_accept_clients(inproc_ep *srv)
{
	inproc_ep *cli, *nclient;

	nclient = nni_list_first(&srv->clients);
	while ((cli = nclient) != NULL) {
		nni_aio *caio;
		nclient = nni_list_next(&srv->clients, nclient);
		NNI_LIST_FOREACH (&cli->aios, caio) {

			inproc_pipe *cpipe;
			inproc_pipe *spipe;
			inproc_pair *pair;
			nni_aio     *saio;
			int          rv;

			if ((saio = nni_list_first(&srv->aios)) == NULL) {
				// No outstanding accept() calls.
				break;
			}

			if ((pair = NNI_ALLOC_STRUCT(pair)) == NULL) {
				inproc_conn_finish(
				    caio, NNG_ENOMEM, cli, NULL);
				inproc_conn_finish(
				    saio, NNG_ENOMEM, srv, NULL);
				continue;
			}
			for (int i = 0; i < 2; i++) {
				nni_aio_list_init(&pair->queues[i].readers);
				nni_aio_list_init(&pair->queues[i].writers);
				nni_mtx_init(&pair->queues[i].lock);
			}
			nni_refcnt_init(
			    &pair->ref, 2, pair, inproc_pair_destroy);

			spipe = cpipe = NULL;
			if (((rv = nni_pipe_alloc_dialer(
			          (void **) &cpipe, cli->dialer)) != 0) ||
			    ((rv = nni_pipe_alloc_listener(
			          (void **) &spipe, srv->listener)) != 0)) {

				if (cpipe != NULL) {
					nni_pipe_close(cpipe->pipe);
					nni_pipe_rele(cpipe->pipe);
				} else {
					nni_refcnt_rele(&pair->ref);
				}
				if (spipe != NULL) {
					nni_pipe_close(spipe->pipe);
					nni_pipe_rele(spipe->pipe);
				} else {
					nni_refcnt_rele(&pair->ref);
				}
				inproc_conn_finish(caio, rv, cli, NULL);
				inproc_conn_finish(saio, rv, srv, NULL);
				continue;
			}

			cpipe->proto      = cli->proto;
			cpipe->addr       = cli->addr;
			spipe->proto      = srv->proto;
			spipe->addr       = srv->addr;
			cpipe->peer       = spipe->proto;
			spipe->peer       = cpipe->proto;
			cpipe->pair       = pair;
			spipe->pair       = pair;
			cpipe->send_queue = &pair->queues[0];
			cpipe->recv_queue = &pair->queues[1];
			spipe->send_queue = &pair->queues[1];
			spipe->recv_queue = &pair->queues[0];

			inproc_conn_finish(caio, 0, cli, cpipe);
			inproc_conn_finish(saio, 0, srv, spipe);
		}

		if (nni_list_first(&cli->aios) == NULL) {
			// No more outstanding client connects.
			// Normally there should only be one.
			if (nni_list_active(&srv->clients, cli)) {
				nni_list_remove(&srv->clients, cli);
			}
		}
	}
}